

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptErrors.h
# Opt level: O0

void __thiscall
MiniScript::TooManyArgumentsException::TooManyArgumentsException
          (TooManyArgumentsException *this,String *msg)

{
  String local_28;
  String *local_18;
  String *msg_local;
  TooManyArgumentsException *this_local;
  
  local_18 = msg;
  msg_local = (String *)this;
  String::String(&local_28,msg);
  RuntimeException::RuntimeException(&this->super_RuntimeException,&local_28);
  String::~String(&local_28);
  *(undefined ***)&(this->super_RuntimeException).super_MiniscriptException =
       &PTR__TooManyArgumentsException_00197a18;
  return;
}

Assistant:

TooManyArgumentsException(String msg="Too Many Arguments") : RuntimeException(msg) {}